

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_psk_derive_premaster(mbedtls_ssl_context *ssl,mbedtls_key_exchange_type_t key_ex)

{
  mbedtls_ssl_config *pmVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  ulong __n;
  ushort uVar3;
  int iVar4;
  size_t *psVar5;
  long lVar6;
  ushort *puVar7;
  ushort *__dest;
  uchar *__src;
  size_t zlen;
  size_t local_30;
  
  pmVar1 = ssl->conf;
  pmVar2 = ssl->handshake;
  __src = pmVar2->psk;
  if (__src == (uchar *)0x0) {
    psVar5 = &pmVar1->psk_len;
    __src = pmVar1->psk;
  }
  else {
    psVar5 = &pmVar2->psk_len;
  }
  if (3 < key_ex - MBEDTLS_KEY_EXCHANGE_PSK) {
    return -0x6c00;
  }
  __n = *psVar5;
  uVar3 = (ushort)__n;
  switch(key_ex) {
  case MBEDTLS_KEY_EXCHANGE_PSK:
    *(ushort *)pmVar2->premaster = uVar3 << 8 | uVar3 >> 8;
    if (0x422 < __n) {
      return -0x7100;
    }
    memset(pmVar2->premaster + 2,0,__n);
    lVar6 = __n + 0x662;
    goto LAB_0011200e;
  case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    iVar4 = mbedtls_dhm_calc_secret
                      (&pmVar2->dhm_ctx,pmVar2->premaster + 2,0x422,&local_30,
                       (_func_int_void_ptr_uchar_ptr_size_t *)pmVar1->f_rng,pmVar1->p_rng);
    break;
  case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    pmVar2->premaster[0] = '\0';
    pmVar2->premaster[1] = '0';
    lVar6 = 0x692;
    goto LAB_0011200e;
  case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
    iVar4 = mbedtls_ecdhopt_shared_secret
                      (&pmVar2->ecdh_ctx,&local_30,pmVar2->premaster + 2,0x422,
                       (_func_int_void_ptr_uchar_ptr_size_t *)pmVar1->f_rng,pmVar1->p_rng);
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  *(ushort *)pmVar2->premaster = (ushort)local_30 << 8 | (ushort)local_30 >> 8;
  lVar6 = local_30 + 0x662;
LAB_0011200e:
  iVar4 = -0x7100;
  if (lVar6 < 0xa83) {
    puVar7 = (ushort *)((long)&(pmVar2->hash_algs).rsa + lVar6);
    __dest = puVar7 + 1;
    *puVar7 = uVar3 << 8 | uVar3 >> 8;
    if (__n <= (ulong)((long)pmVar2 + (0xa84 - (long)__dest))) {
      memcpy(__dest,__src,__n);
      ssl->handshake->pmslen = (long)__dest + (__n - (long)ssl->handshake) + -0x660;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_ssl_psk_derive_premaster( mbedtls_ssl_context *ssl, mbedtls_key_exchange_type_t key_ex )
{
    unsigned char *p = ssl->handshake->premaster;
    unsigned char *end = p + sizeof( ssl->handshake->premaster );
    const unsigned char *psk = ssl->conf->psk;
    size_t psk_len = ssl->conf->psk_len;

    /* If the psk callback was called, use its result */
    if( ssl->handshake->psk != NULL )
    {
        psk = ssl->handshake->psk;
        psk_len = ssl->handshake->psk_len;
    }

    /*
     * PMS = struct {
     *     opaque other_secret<0..2^16-1>;
     *     opaque psk<0..2^16-1>;
     * };
     * with "other_secret" depending on the particular key exchange
     */
#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_PSK )
    {
        if( end - p < 2 )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        *(p++) = (unsigned char)( psk_len >> 8 );
        *(p++) = (unsigned char)( psk_len      );

        if( end < p || (size_t)( end - p ) < psk_len )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        memset( p, 0, psk_len );
        p += psk_len;
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        /*
         * other_secret already set by the ClientKeyExchange message,
         * and is 48 bytes long
         */
        *p++ = 0;
        *p++ = 48;
        p += 48;
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        int ret;
        size_t len;

        /* Write length only when we know the actual value */
        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      p + 2, end - ( p + 2 ), &len,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( ret );
        }
        *(p++) = (unsigned char)( len >> 8 );
        *(p++) = (unsigned char)( len );
        p += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        int ret;
        size_t zlen;

        if( ( ret = mbedtls_ecdhopt_shared_secret( &ssl->handshake->ecdh_ctx, &zlen,
                                       p + 2, end - ( p + 2 ),
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdhopt_shared_secret", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( zlen >> 8 );
        *(p++) = (unsigned char)( zlen      );
        p += zlen;

    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /* opaque psk<0..2^16-1>; */
    if( end - p < 2 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    *(p++) = (unsigned char)( psk_len >> 8 );
    *(p++) = (unsigned char)( psk_len      );

    if( end < p || (size_t)( end - p ) < psk_len )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    memcpy( p, psk, psk_len );
    p += psk_len;

    ssl->handshake->pmslen = p - ssl->handshake->premaster;

    return( 0 );
}